

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_layout.cc
# Opt level: O0

void __thiscall
Typelib::MemoryLayout::pushInit
          (MemoryLayout *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  size_type size;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_28;
  const_iterator local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  MemoryLayout *this_local;
  
  local_18 = data;
  data_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
  pushInitGenericOp(this,0,size);
  local_28._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->init_ops);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_20,&local_28);
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_18);
  __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(local_18);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->init_ops,local_20,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current);
  return;
}

Assistant:

void MemoryLayout::pushInit(std::vector<uint8_t> const& data)
{
    pushInitGenericOp(FLAG_INIT, data.size());
    init_ops.insert(init_ops.end(), data.begin(), data.end());
}